

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

Fts5Structure * fts5StructureRead(Fts5Index *p)

{
  uint uVar1;
  u8 *puVar2;
  u32 uVar3;
  u32 uVar4;
  Fts5Config *pConfig;
  u8 *puVar5;
  uint *puVar6;
  ulong uVar7;
  u32 uVar8;
  byte bVar9;
  byte bVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  i64 iVar16;
  Fts5Data *p_00;
  Fts5Structure *pFVar17;
  Fts5StructureSegment *pFVar18;
  ulong uVar19;
  Fts5StructureLevel *v;
  u32 uVar20;
  ulong uVar21;
  long lVar22;
  u32 *v_00;
  uint uVar23;
  u32 *v_01;
  u64 uVar24;
  ulong uVar25;
  ulong uVar26;
  long in_FS_OFFSET;
  bool bVar27;
  bool bVar28;
  int nLevel;
  ulong local_a0;
  u32 local_48;
  u32 local_44;
  u32 local_40;
  int local_3c;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (p->pStruct == (Fts5Structure *)0x0) {
    iVar16 = fts5IndexDataVersion(p);
    p->iStructVersion = iVar16;
    if (p->rc == 0) {
      pConfig = p->pConfig;
      p_00 = fts5DataRead(p,10);
      pFVar17 = (Fts5Structure *)0x0;
      if (p->rc == 0) {
        puVar5 = p_00->p;
        iVar15 = p_00->nn;
        puVar2 = puVar5 + (long)iVar15 + 0x10;
        puVar2[0] = '\0';
        puVar2[1] = '\0';
        puVar2[2] = '\0';
        puVar2[3] = '\0';
        puVar5 = puVar5 + iVar15;
        puVar5[0] = '\0';
        puVar5[1] = '\0';
        puVar5[2] = '\0';
        puVar5[3] = '\0';
        puVar5[4] = '\0';
        puVar5[5] = '\0';
        puVar5[6] = '\0';
        puVar5[7] = '\0';
        puVar5[8] = '\0';
        puVar5[9] = '\0';
        puVar5[10] = '\0';
        puVar5[0xb] = '\0';
        puVar5[0xc] = '\0';
        puVar5[0xd] = '\0';
        puVar5[0xe] = '\0';
        puVar5[0xf] = '\0';
        puVar6 = (uint *)p_00->p;
        iVar15 = p_00->nn;
        local_3c = 0;
        local_40 = 0;
        local_44 = 0;
        bVar27 = puVar6[1] == 0x10000ff;
        uVar23 = *puVar6;
        iVar11 = sqlite3Fts5GetVarint32((uchar *)(puVar6 + (ulong)bVar27 + 1),&local_40);
        iVar12 = sqlite3Fts5GetVarint32
                           ((uchar *)((ulong)(iVar11 + (uint)bVar27 * 4 + 4) + (long)puVar6),
                            &local_44);
        uVar8 = local_40;
        uVar20 = local_44;
        uVar25 = (ulong)(int)local_40;
        if (local_44 < 0x7d1 && uVar25 < 0x7d1) {
          pFVar17 = (Fts5Structure *)sqlite3Fts5MallocZero(&local_3c,(uVar25 - 1) * 0x10 + 0x30);
          if (pFVar17 == (Fts5Structure *)0x0) {
            pFVar17 = (Fts5Structure *)0x0;
            iVar15 = local_3c;
          }
          else {
            uVar1 = iVar12 + 4 + iVar11 + (uint)bVar27 * 4;
            pFVar17->nRef = 1;
            pFVar17->nLevel = uVar8;
            pFVar17->nSegment = uVar20;
            bVar9 = sqlite3Fts5GetVarint
                              ((uchar *)((ulong)uVar1 + (long)puVar6),&pFVar17->nWriteCounter);
            bVar28 = local_3c == 0;
            uVar24 = 1;
            if (0 < (int)uVar8 && bVar28) {
              iVar11 = uVar1 + bVar9;
              uVar19 = 0;
              local_a0 = 0;
              do {
                v = pFVar17->aLevel + uVar19;
                local_48 = 0;
                if (iVar11 < iVar15) {
                  iVar12 = sqlite3Fts5GetVarint32((uchar *)((long)iVar11 + (long)puVar6),(u32 *)v);
                  iVar13 = sqlite3Fts5GetVarint32
                                     ((uchar *)((long)(iVar12 + iVar11) + (long)puVar6),&local_48);
                  uVar8 = local_48;
                  if ((int)local_48 < v->nMerge) {
                    local_3c = 0x10b;
                  }
                  iVar11 = iVar12 + iVar11 + iVar13;
                  pFVar18 = (Fts5StructureSegment *)
                            sqlite3Fts5MallocZero(&local_3c,(long)(int)local_48 * 0x38);
                  v->aSeg = pFVar18;
                  uVar20 = uVar20 - uVar8;
                }
                else {
                  local_3c = 0x10b;
                }
                uVar8 = local_48;
                if (local_3c == 0) {
                  uVar21 = (ulong)(int)local_48;
                  v->nSeg = local_48;
                  iVar12 = local_3c;
                  if (0 < (long)uVar21) {
                    lVar22 = 0x30;
                    uVar26 = 1;
                    do {
                      if (iVar11 < iVar15) {
                        pFVar18 = v->aSeg;
                        iVar13 = sqlite3Fts5GetVarint32
                                           ((uchar *)((long)iVar11 + (long)puVar6),
                                            (u32 *)((long)pFVar18 + lVar22 + -0x30));
                        v_01 = (u32 *)((long)pFVar18 + lVar22 + -0x2c);
                        iVar14 = sqlite3Fts5GetVarint32
                                           ((uchar *)((long)puVar6 + (long)(iVar13 + iVar11)),v_01);
                        iVar14 = iVar13 + iVar11 + iVar14;
                        v_00 = (u32 *)((long)pFVar18 + lVar22 + -0x28);
                        iVar11 = sqlite3Fts5GetVarint32((uchar *)((long)puVar6 + (long)iVar14),v_00)
                        ;
                        iVar11 = iVar14 + iVar11;
                        if (bVar27) {
                          bVar9 = sqlite3Fts5GetVarint
                                            ((uchar *)((long)puVar6 + (long)iVar11),
                                             (u64 *)((long)pFVar18 + lVar22 + -0x20));
                          bVar10 = sqlite3Fts5GetVarint
                                             ((uchar *)((long)puVar6 +
                                                       (long)(int)(iVar11 + (uint)bVar9)),
                                              (u64 *)((long)pFVar18 + lVar22 + -0x18));
                          iVar11 = iVar11 + (uint)bVar9 + (uint)bVar10;
                          iVar13 = sqlite3Fts5GetVarint32
                                             ((uchar *)((long)puVar6 + (long)iVar11),
                                              (u32 *)((long)pFVar18 + lVar22 + -0x10));
                          iVar11 = iVar11 + iVar13;
                          bVar9 = sqlite3Fts5GetVarint
                                            ((uchar *)((long)puVar6 + (long)iVar11),
                                             (u64 *)((long)pFVar18 + lVar22 + -8));
                          iVar11 = iVar11 + (uint)bVar9;
                          bVar9 = sqlite3Fts5GetVarint
                                            ((uchar *)((long)puVar6 + (long)iVar11),
                                             (u64 *)((long)&pFVar18->iSegid + lVar22));
                          iVar11 = iVar11 + (uint)bVar9;
                          uVar7 = *(ulong *)((long)pFVar18 + lVar22 + -0x18);
                          if (local_a0 <= uVar7) {
                            local_a0 = uVar7;
                          }
                        }
                        uVar4 = *v_00;
                        uVar3 = *v_01;
                        bVar28 = (int)uVar3 <= (int)uVar4;
                        if ((int)uVar4 < (int)uVar3) {
                          iVar12 = 0x10b;
                        }
                      }
                      else {
                        iVar12 = 0x10b;
                        bVar28 = false;
                      }
                      if (!bVar28) break;
                      lVar22 = lVar22 + 0x38;
                      bVar28 = uVar26 < uVar21;
                      uVar26 = uVar26 + 1;
                    } while (bVar28);
                  }
                  local_3c = iVar12;
                  if (((uVar19 != 0) && (uVar8 == 0)) && ((int)*(u64 *)(v + -1) != 0)) {
                    local_3c = 0x10b;
                  }
                  if ((uVar19 == (uVar25 - 1 & 0xffffffff)) && (v->nMerge != 0)) {
                    local_3c = 0x10b;
                  }
                }
                bVar28 = local_3c == 0;
              } while ((bVar28) && (uVar19 = uVar19 + 1, uVar19 < uVar25));
              uVar24 = local_a0 + 1;
            }
            if (!(bool)(bVar28 ^ 1U | uVar20 == 0)) {
              local_3c = 0x10b;
            }
            if (bVar27) {
              pFVar17->nOriginCntr = uVar24;
            }
            iVar15 = local_3c;
            local_44 = uVar20;
            if (local_3c != 0) {
              fts5StructureRelease(pFVar17);
              pFVar17 = (Fts5Structure *)0x0;
              iVar15 = local_3c;
            }
          }
        }
        else {
          pFVar17 = (Fts5Structure *)0x0;
          iVar15 = 0x10b;
        }
        p->rc = iVar15;
        if ((iVar15 == 0) &&
           ((uVar23 = uVar23 >> 0x18 | (uVar23 & 0xff0000) >> 8 | (uVar23 & 0xff00) << 8 |
                      uVar23 << 0x18, pConfig->pgsz == 0 || (pConfig->iCookie != uVar23)))) {
          iVar15 = sqlite3Fts5ConfigLoad(pConfig,uVar23);
          p->rc = iVar15;
        }
        sqlite3_free(p_00);
        if (p->rc != 0) {
          fts5StructureRelease(pFVar17);
          pFVar17 = (Fts5Structure *)0x0;
        }
      }
      p->pStruct = pFVar17;
    }
  }
  if (p->rc == 0) {
    pFVar17 = p->pStruct;
    pFVar17->nRef = pFVar17->nRef + 1;
  }
  else {
    pFVar17 = (Fts5Structure *)0x0;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return pFVar17;
}

Assistant:

static Fts5Structure *fts5StructureRead(Fts5Index *p){

  if( p->pStruct==0 ){
    p->iStructVersion = fts5IndexDataVersion(p);
    if( p->rc==SQLITE_OK ){
      p->pStruct = fts5StructureReadUncached(p);
    }
  }

#if 0
  else{
    Fts5Structure *pTest = fts5StructureReadUncached(p);
    if( pTest ){
      int i, j;
      assert_nc( p->pStruct->nSegment==pTest->nSegment );
      assert_nc( p->pStruct->nLevel==pTest->nLevel );
      for(i=0; i<pTest->nLevel; i++){
        assert_nc( p->pStruct->aLevel[i].nMerge==pTest->aLevel[i].nMerge );
        assert_nc( p->pStruct->aLevel[i].nSeg==pTest->aLevel[i].nSeg );
        for(j=0; j<pTest->aLevel[i].nSeg; j++){
          Fts5StructureSegment *p1 = &pTest->aLevel[i].aSeg[j];
          Fts5StructureSegment *p2 = &p->pStruct->aLevel[i].aSeg[j];
          assert_nc( p1->iSegid==p2->iSegid );
          assert_nc( p1->pgnoFirst==p2->pgnoFirst );
          assert_nc( p1->pgnoLast==p2->pgnoLast );
        }
      }
      fts5StructureRelease(pTest);
    }
  }
#endif

  if( p->rc!=SQLITE_OK ) return 0;
  assert( p->iStructVersion!=0 );
  assert( p->pStruct!=0 );
  fts5StructureRef(p->pStruct);
  return p->pStruct;
}